

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O1

void __thiscall QMakeGlobals::~QMakeGlobals(QMakeGlobals *this)

{
  Data *pDVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  Data *pDVar5;
  long lVar6;
  const_iterator begin;
  
  pDVar5 = (this->baseEnvs).d;
  if (pDVar5 == (Data *)0x0) {
    pDVar5 = (Data *)0x0;
  }
  else if (pDVar5->spans->offsets[0] == 0xff) {
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (pDVar5->numBuckets == uVar4) {
        pDVar5 = (Data *)0x0;
        uVar4 = 0;
        break;
      }
      uVar3 = uVar4 + 1;
    } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    goto LAB_002888cc;
  }
  uVar4 = 0;
LAB_002888cc:
  begin.i.bucket = uVar4;
  begin.i.d = pDVar5;
  qDeleteAll<QHash<QMakeBaseKey,QMakeBaseEnv*>::const_iterator>(begin,(const_iterator)ZEXT816(0));
  QHash<QMakeBaseKey,_QMakeBaseEnv_*>::~QHash(&this->baseEnvs);
  pDVar1 = (this->build_root).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->build_root).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->source_root).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->source_root).d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar6 = 0;
  do {
    piVar2 = *(int **)((long)&this->extra_cmds[3].d.d + lVar6);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&this->extra_cmds[3].d.d + lVar6),2,0x10);
      }
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x60);
  pDVar1 = (this->user_template_prefix).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->user_template_prefix).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->user_template).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->user_template).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->xqmakespec).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->xqmakespec).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->qmakespec).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->qmakespec).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->qtconf).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->qtconf).d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->qmake_extra_args).d);
  QArrayDataPointer<QString>::~QArrayDataPointer(&(this->qmake_args).d);
  pDVar1 = (this->qmake_abslocation).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->qmake_abslocation).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->cachefile).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->cachefile).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->dirlist_sep).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->dirlist_sep).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->dir_sep).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->dir_sep).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QMakeGlobals::~QMakeGlobals()
{
    qDeleteAll(baseEnvs);
}